

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2FindAndConsume(void)

{
  bool bVar1;
  string word;
  string s;
  RE2 r;
  StringPiece local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  char *local_290;
  int local_288;
  LogMessageFatal local_270;
  RE2 local_f0;
  
  RE2::RE2(&local_f0,"(\\w+)");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_290,"   aaa b!@#$@#$cccc",(allocator *)&local_270);
  local_2c0.ptr_ = local_290;
  local_2c0.length_ = local_288;
  local_270.super_LogMessage._0_8_ = &local_2b0;
  bVar1 = RE2::FindAndConsume<std::__cxx11::string*>
                    (&local_2c0,&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x115);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: RE2::FindAndConsume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  bVar1 = std::operator==(&local_2b0,"aaa");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x116);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,"Check failed: (word) == (\"aaa\")")
    ;
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_270.super_LogMessage._0_8_ = &local_2b0;
  bVar1 = RE2::FindAndConsume<std::__cxx11::string*>
                    (&local_2c0,&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x117);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: RE2::FindAndConsume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  bVar1 = std::operator==(&local_2b0,"b");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x118);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,"Check failed: (word) == (\"b\")");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_270.super_LogMessage._0_8_ = &local_2b0;
  bVar1 = RE2::FindAndConsume<std::__cxx11::string*>
                    (&local_2c0,&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x119);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: RE2::FindAndConsume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  bVar1 = std::operator==(&local_2b0,"cccc");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x11a);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,"Check failed: (word) == (\"cccc\")"
                   );
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_270.super_LogMessage._0_8_ = &local_2b0;
  bVar1 = RE2::FindAndConsume<std::__cxx11::string*>
                    (&local_2c0,&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_270);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x11b);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: ! RE2::FindAndConsume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_2c0.ptr_ = "aaa";
  local_2c0.length_ = 3;
  RE2::RE2((RE2 *)&local_270,"aaa");
  bVar1 = RE2::FindAndConsume<>(&local_2c0,(RE2 *)&local_270);
  RE2::~RE2((RE2 *)&local_270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x121);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: RE2::FindAndConsume(&input, \"aaa\")");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_270.super_LogMessage._0_8_ = "";
  local_270.super_LogMessage._8_4_ = 0;
  bVar1 = StringPiece::_equal(&local_2c0,(StringPiece *)&local_270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x122);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,"Check failed: (input) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  RE2::~RE2(&local_f0);
  return;
}

Assistant:

TEST(RE2, FindAndConsume) {
  VLOG(1) << "TestFindAndConsume";

  RE2 r("(\\w+)");      // matches a word
  string word;

  string s("   aaa b!@#$@#$cccc");
  StringPiece input(s);

  CHECK(RE2::FindAndConsume(&input, r, &word));
  CHECK_EQ(word, "aaa");
  CHECK(RE2::FindAndConsume(&input, r, &word));
  CHECK_EQ(word, "b");
  CHECK(RE2::FindAndConsume(&input, r, &word));
  CHECK_EQ(word, "cccc");
  CHECK(! RE2::FindAndConsume(&input, r, &word));

  // Check that FindAndConsume works without any submatches.
  // Earlier version used uninitialized data for
  // length to consume.
  input = "aaa";
  CHECK(RE2::FindAndConsume(&input, "aaa"));
  CHECK_EQ(input, "");
}